

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  pointer pGVar2;
  _Elt_pointer pTVar3;
  pointer pcVar4;
  bool bVar5;
  pointer pGVar6;
  pointer pGVar7;
  pointer pGVar8;
  pointer pvVar9;
  pointer pvVar10;
  char cVar11;
  int iVar12;
  nodeId_t nVar13;
  ostream *poVar14;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *pvVar15;
  LargeFirstAlgorithm *this;
  undefined4 extraout_var;
  ulong uVar16;
  deque<van_kampen::Node,_std::allocator<van_kampen::Node>_> *pdVar17;
  mapped_type *pmVar18;
  Node *pNVar19;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pdVar20;
  long *plVar21;
  invalid_argument *piVar22;
  long *plVar23;
  size_type *psVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  pointer pTVar26;
  long lVar27;
  _Elt_pointer pTVar28;
  Graph *pGVar29;
  ulong uVar30;
  undefined8 uVar31;
  _Elt_pointer pNVar32;
  Graph *pGVar33;
  char cVar34;
  char *pcVar35;
  _Elt_pointer pNVar36;
  Graph *this_00;
  _Map_pointer ppTVar37;
  _Map_pointer ppNVar38;
  long lVar39;
  _Elt_pointer __k;
  _Elt_pointer pNVar40;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  words;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> word;
  nodeId_t from;
  string __str;
  string text;
  value_type hub;
  ConsoleFlags flags;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  newNames;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  color;
  ofstream wordOutputFile;
  ifstream inputFile;
  _Elt_pointer local_708;
  int local_6fc;
  _Map_pointer local_6f8;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  local_6f0;
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [24];
  _Map_pointer ppGStack_6b0;
  Graph *local_6a8;
  Graph *pGStack_6a0;
  _Elt_pointer local_698;
  _Map_pointer ppGStack_690;
  string_type local_688;
  undefined8 local_668;
  _Map_pointer local_660;
  _Map_pointer local_658;
  Graph *local_650;
  long *local_648;
  long local_640;
  long local_638;
  long lStack_630;
  undefined1 local_628 [8];
  _Alloc_hider local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_610;
  bool local_600;
  bool local_5f8;
  double local_5f0;
  bool local_5e8;
  long *local_5e0;
  uint local_5d8;
  long local_5d0 [2];
  string local_5c0;
  _Elt_pointer local_5a0;
  _Map_pointer local_598;
  Node *local_590;
  _Elt_pointer local_588;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_580;
  undefined1 local_568 [64];
  _Alloc_hider local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  size_t local_508;
  int local_500;
  bool local_4f8;
  bool local_4f7;
  bool local_4f5;
  bool local_4f4;
  bool local_4f3;
  bool local_4f2;
  bool local_4f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  graphOutputFormat local_4d0;
  _Alloc_hider local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  undefined1 local_4a8 [32];
  float local_488;
  size_t local_480;
  __node_base_ptr p_Stack_478;
  undefined1 local_470 [32];
  float local_450;
  size_t local_448;
  __node_base_ptr p_Stack_440;
  undefined1 local_438 [8];
  size_t sStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Elt_pointer local_418;
  _Map_pointer ppNStack_410;
  _Elt_pointer local_408;
  _Elt_pointer pNStack_400;
  _Elt_pointer local_3f8;
  _Map_pointer ppNStack_3f0;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_3e8 [3];
  ios_base local_340 [264];
  long local_238 [4];
  int aiStack_218 [50];
  undefined8 auStack_150 [36];
  
  van_kampen::ConsoleFlags::ConsoleFlags((ConsoleFlags *)local_568,argc,argv);
  std::ifstream::ifstream(local_238,(string *)local_568,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    piVar22 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d8,
                   "cannot open \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568);
    plVar21 = (long *)std::__cxx11::string::append(local_6d8);
    local_438 = (undefined1  [8])*plVar21;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar21 + 2);
    if (local_438 == (undefined1  [8])paVar25) {
      local_428._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_428._8_8_ = plVar21[3];
      local_438 = (undefined1  [8])&local_428;
    }
    else {
      local_428._M_allocated_capacity = paVar25->_M_allocated_capacity;
    }
    sStack_430 = plVar21[1];
    *plVar21 = (long)paVar25;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar22,(string *)local_438);
    __cxa_throw(piVar22,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_5c0,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff,0,
             0xffffffff);
  van_kampen::GroupRepresentationParser::parse(&local_6f0,&local_5c0);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&local_580,
             local_6f0.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  if (local_4f7 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Total relations count: ",0x17);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Hub size: ",10);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  local_6f0.
  super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6f0.
       super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (local_6f0.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pvVar10 = local_6f0.
            super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar9 = local_6f0.
           super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_4f8 == true) {
    if ((local_6f0.
         super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_6f0.
         super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (local_6f0.
        super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 1 !=
        local_6f0.
        super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      lVar39 = 0x18;
      do {
        iVar12 = rand();
        lVar27 = (long)iVar12 % ((lVar39 >> 3) * -0x5555555555555555 + 1);
        if (lVar39 != lVar27 * 0x18) {
          pvVar15 = pvVar9 + lVar27;
          pGVar2 = *(pointer *)
                    ((long)&(pvVar9->
                            super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar39);
          puVar1 = (undefined8 *)
                   ((long)&(pvVar9->
                           super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar39);
          pGVar6 = (pointer)*puVar1;
          pGVar7 = (pointer)puVar1[1];
          *(pointer *)
           ((long)&(pvVar9->
                   super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar39) =
               (pvVar15->
               super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
          pGVar8 = (pvVar15->
                   super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar1 = (undefined8 *)
                   ((long)&(pvVar9->
                           super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                           )._M_impl.super__Vector_impl_data._M_finish + lVar39);
          *puVar1 = (pvVar15->
                    super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          puVar1[1] = pGVar8;
          (pvVar15->
          super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>).
          _M_impl.super__Vector_impl_data._M_start = pGVar6;
          (pvVar15->
          super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>).
          _M_impl.super__Vector_impl_data._M_finish = pGVar7;
          (pvVar15->
          super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = pGVar2;
        }
        pvVar15 = (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
                  ((long)&pvVar9[1].
                          super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar39);
        lVar39 = lVar39 + 0x18;
      } while (pvVar15 != pvVar10);
    }
  }
  pvVar9 = local_6f0.
           super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4f2 == false) {
    if (local_6f0.
        super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_6f0.
        super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar39 = ((long)local_6f0.
                      super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_6f0.
                      super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
                           *)local_438,
                          (__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                           )local_6f0.
                            super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (lVar39 - (lVar39 + 1 >> 0x3f)) + 1 >> 1);
      if ((_Elt_pointer)local_428._M_allocated_capacity == (_Elt_pointer)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (local_6f0.
                   super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,pvVar9);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>,std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (local_6f0.
                   super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,pvVar9,local_428._M_allocated_capacity,
                   sStack_430);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
                  *)local_438);
    }
  }
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::push_back(&local_6f0,&local_580);
  if (local_4f5 == true) {
    this = (LargeFirstAlgorithm *)operator_new(0x40);
    van_kampen::IterativeAlgorithm::IterativeAlgorithm((IterativeAlgorithm *)this);
  }
  else {
    if (local_4f4 != true) {
      if (local_4f3 == true) {
        this = (LargeFirstAlgorithm *)operator_new(0x40);
        van_kampen::LargeFirstAlgorithm::LargeFirstAlgorithm(this);
        this->cellsLimit = local_508;
        this->quiet = local_4f7;
        this->maximalSmallForOneBig = local_500;
      }
      else {
        this = (LargeFirstAlgorithm *)0x0;
      }
      goto LAB_00129476;
    }
    this = (LargeFirstAlgorithm *)operator_new(0x40);
    van_kampen::MergingAlgorithm::MergingAlgorithm((MergingAlgorithm *)this);
  }
  this->cellsLimit = local_508;
  this->quiet = local_4f7;
LAB_00129476:
  (**(this->super_DiagrammGeneratingAlgorithm)._vptr_DiagrammGeneratingAlgorithm)(this,&local_6f0);
  std::ofstream::ofstream(local_438,(string *)&local_528,_S_out);
  if (*(int *)((long)&local_418 + (long)*(_Map_pointer)((long)local_438 + -0x18)) == 0) {
    iVar12 = (*(this->super_DiagrammGeneratingAlgorithm)._vptr_DiagrammGeneratingAlgorithm[1])();
    van_kampen::Diagramm::getCircuit
              ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)local_6d8,
               (Diagramm *)CONCAT44(extraout_var,iVar12));
    if (local_6d8._8_8_ != local_6d8._0_8_) {
      lVar39 = 0x28;
      uVar30 = 0;
      do {
        uVar31 = local_6d8._0_8_;
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_438,*(char **)(local_6d8._0_8_ + lVar39 + -0x20),
                             *(long *)(local_6d8._0_8_ + lVar39 + -0x18));
        pcVar35 = "";
        if ((ulong)*(byte *)(uVar31 + lVar39) != 0) {
          pcVar35 = "^(-1)";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,pcVar35,(ulong)*(byte *)(uVar31 + lVar39) * 5);
        uVar16 = ((long)(local_6d8._8_8_ - local_6d8._0_8_) >> 3) * -0x71c71c71c71c71c7;
        if (uVar30 < uVar16 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"*",1);
          uVar16 = ((long)(local_6d8._8_8_ - local_6d8._0_8_) >> 3) * -0x71c71c71c71c71c7;
        }
        uVar30 = uVar30 + 1;
        lVar39 = lVar39 + 0x48;
      } while (uVar30 < uVar16);
    }
    std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::~vector
              ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)local_6d8)
    ;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cannot write to file \'",0x16);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_528._M_p,local_520);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  local_438 = (undefined1  [8])_VTT;
  local_660 = _VTT;
  local_668 = _memcpy;
  *(undefined8 *)(local_438 + (long)_VTT[-3]) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&sStack_430);
  std::ios_base::~ios_base(local_340);
  if (local_4f1 == false) {
    std::ofstream::ofstream(local_438,(string *)(local_568 + 0x20),_S_out);
    if (*(int *)((long)&local_418 + (long)*(_Map_pointer)((long)local_438 + -0x18)) != 0) {
      piVar22 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
                     "cannot write to file \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_568 + 0x20));
      plVar21 = (long *)std::__cxx11::string::append(local_628);
      local_6d8._0_8_ = *plVar21;
      pTVar26 = (pointer)(plVar21 + 2);
      if ((pointer)local_6d8._0_8_ == pTVar26) {
        local_6c8._0_8_ = *(undefined8 *)pTVar26;
        local_6c8._8_8_ = plVar21[3];
        local_6d8._0_8_ = (pointer)(local_6d8 + 0x10);
      }
      else {
        local_6c8._0_8_ = *(undefined8 *)pTVar26;
      }
      local_6d8._8_8_ = plVar21[1];
      *plVar21 = (long)pTVar26;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar22,(string *)local_6d8);
      __cxa_throw(piVar22,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    van_kampen::Graph::printSelf
              ((this->super_DiagrammGeneratingAlgorithm).graph_.
               super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ostream *)local_438,local_4d0);
    local_438 = (undefined1  [8])local_660;
    *(undefined8 *)(local_438 + (long)local_660[-3]) = local_668;
    std::filebuf::~filebuf((filebuf *)&sStack_430);
    std::ios_base::~ios_base(local_340);
  }
  else {
    pGVar29 = (this->super_DiagrammGeneratingAlgorithm).graph_.
              super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_470._0_8_ = &p_Stack_440;
    local_470._8_8_ = 1;
    local_470._16_8_ = (_Hash_node_base *)0x0;
    local_470._24_8_ = 0;
    local_450 = 1.0;
    local_448 = 0;
    p_Stack_440 = (__node_base_ptr)0x0;
    local_6d8._0_8_ = (pointer)0x0;
    local_6d8._8_8_ = (pointer)0x0;
    local_6c8._0_8_ = (Graph *)0x0;
    local_6c8._8_8_ = (_Elt_pointer)0x0;
    local_6c8._16_8_ = (Graph *)0x0;
    ppGStack_6b0 = (_Map_pointer)0x0;
    local_6a8 = (Graph *)0x0;
    pGStack_6a0 = (Graph *)0x0;
    local_698 = (_Elt_pointer)0x0;
    ppGStack_690 = (_Map_pointer)0x0;
    std::_Deque_base<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::_M_initialize_map
              ((_Deque_base<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)local_6d8,0);
    pdVar17 = van_kampen::Graph::nodes(pGVar29);
    pNVar36 = (pdVar17->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    pNVar40 = (pdVar17->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pNVar36 != pNVar40) {
      pNVar32 = (pdVar17->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      ppNVar38 = (pdVar17->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      local_6fc = 1;
      local_650 = pGVar29;
      local_5a0 = pNVar40;
      do {
        nVar13 = van_kampen::Node::getId(pNVar36);
        local_438._0_4_ = nVar13;
        pmVar18 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_470,(key_type *)local_438);
        if (*pmVar18 == 0) {
          local_588 = pNVar32;
          memset((Graph *)local_438,0,0x88);
          std::_Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>::_M_initialize_map
                    ((_Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_> *)local_438,0
                    );
          local_3e8[0]._M_buckets = &local_3e8[0]._M_single_bucket;
          local_3e8[0]._M_bucket_count = 1;
          local_3e8[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_3e8[0]._M_element_count = 0;
          local_3e8[0]._M_rehash_policy._M_max_load_factor = 1.0;
          local_3e8[0]._M_rehash_policy._M_next_resize = 0;
          local_3e8[0]._M_single_bucket = (__node_base_ptr)0x0;
          std::deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::
          emplace_back<van_kampen::Graph>
                    ((deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)local_6d8,
                     (Graph *)local_438);
          std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(local_3e8);
          std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::~deque
                    ((deque<van_kampen::Node,_std::allocator<van_kampen::Node>_> *)local_438);
          local_4a8._0_8_ = &p_Stack_478;
          local_4a8._8_8_ = 1;
          local_4a8._16_8_ = (_Hash_node_base *)0x0;
          local_4a8._24_8_ = 0;
          local_488 = 1.0;
          local_480 = 0;
          p_Stack_478 = (__node_base_ptr)0x0;
          local_3f8 = (_Elt_pointer)0x0;
          ppNStack_3f0 = (_Map_pointer)0x0;
          local_408 = (_Elt_pointer)0x0;
          pNStack_400 = (_Elt_pointer)0x0;
          local_418 = (_Elt_pointer)0x0;
          ppNStack_410 = (_Map_pointer)0x0;
          local_428._M_allocated_capacity = 0;
          local_428._8_8_ = (_Elt_pointer)0x0;
          local_438 = (undefined1  [8])0x0;
          sStack_430 = 0;
          std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
                    ((_Deque_base<int,_std::allocator<int>_> *)local_438,0);
          nVar13 = van_kampen::Node::getId(pNVar36);
          pGVar33 = local_6a8;
          if (local_6a8 == pGStack_6a0) {
            pGVar33 = ppGStack_690[-1] + 3;
          }
          local_598 = ppNVar38;
          local_590 = pNVar36;
          van_kampen::details::dfs<main::__1>
                    (nVar13,pGVar29,
                     (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)local_470,local_6fc,pGVar33 + -1,
                     (deque<int,_std::allocator<int>_> *)local_438,
                     (anon_class_1_0_00000001 *)local_4a8,
                     (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)this);
          pNVar36 = local_408;
          if ((_Elt_pointer)local_428._M_allocated_capacity != local_408) {
            local_708 = local_418;
            local_658 = ppNStack_410;
            uVar31 = local_428._M_allocated_capacity;
            do {
              nVar13 = *(nodeId_t *)
                        &(((_Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                            *)&((_Elt_pointer)uVar31)->position)->_M_impl).super__Vector_impl_data.
                         _M_start;
              local_688._M_dataplus._M_p._0_4_ = nVar13;
              pNVar19 = van_kampen::Graph::node(pGVar29,nVar13);
              pdVar20 = van_kampen::Node::transitions(pNVar19);
              __k = (pdVar20->
                    super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                    )._M_impl.super__Deque_impl_data._M_start._M_cur;
              pTVar3 = (pdVar20->
                       super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (__k != pTVar3) {
                pTVar28 = (pdVar20->
                          super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                          )._M_impl.super__Deque_impl_data._M_start._M_last;
                ppTVar37 = (pdVar20->
                           super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                           )._M_impl.super__Deque_impl_data._M_start._M_node;
                do {
                  if (0.01 <= __k->priority) {
                    pGVar29 = local_6a8;
                    if (local_6a8 == pGStack_6a0) {
                      pGVar29 = ppGStack_690[-1] + 3;
                    }
                    pmVar18 = std::__detail::
                              _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)local_4a8,(key_type *)&local_688);
                    pNVar19 = van_kampen::Graph::node(pGVar29 + -1,*pmVar18);
                    pmVar18 = std::__detail::
                              _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)local_4a8,&__k->to);
                    local_628._0_4_ = *pmVar18;
                    local_620._M_p = (pointer)&local_610;
                    pcVar4 = (__k->label).name._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_620,pcVar4,
                               pcVar4 + (__k->label).name._M_string_length);
                    local_600 = (__k->label).reversed;
                    local_5f8 = __k->isInSquare;
                    local_5f0 = __k->priority;
                    local_5e8 = __k->isInHub;
                    van_kampen::Node::addTransition(pNVar19,(Transition *)local_628);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_620._M_p != &local_610) {
                      operator_delete(local_620._M_p,local_610._M_allocated_capacity + 1);
                    }
                  }
                  __k = __k + 1;
                  if (__k == pTVar28) {
                    __k = ppTVar37[1];
                    ppTVar37 = ppTVar37 + 1;
                    pTVar28 = __k + 7;
                  }
                } while (__k != pTVar3);
              }
              uVar31 = (long)&(((_Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                                 *)&((_Elt_pointer)uVar31)->position)->_M_impl).
                              super__Vector_impl_data._M_start + 4;
              if ((_Elt_pointer)uVar31 == local_708) {
                uVar31 = local_658[1];
                local_658 = local_658 + 1;
                local_708 = (_Elt_pointer)
                            ((long)&(((_Elt_pointer)(uVar31 + 0x170))->label_).field_2 + 8);
              }
              pGVar29 = local_650;
            } while ((_Elt_pointer)uVar31 != pNVar36);
          }
          local_6fc = local_6fc + 1;
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                    ((_Deque_base<int,_std::allocator<int>_> *)local_438);
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_4a8);
          pNVar32 = local_588;
          pNVar36 = local_590;
          ppNVar38 = local_598;
          pNVar40 = local_5a0;
        }
        pNVar36 = pNVar36 + 1;
        if (pNVar36 == pNVar32) {
          pNVar36 = ppNVar38[1];
          ppNVar38 = ppNVar38 + 1;
          pNVar32 = pNVar36 + 2;
        }
      } while (pNVar36 != pNVar40);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_470);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_438,&local_4f0,auto_format);
    std::filesystem::create_directory((path *)local_438);
    std::filesystem::__cxx11::path::~path((path *)local_438);
    pGVar29 = local_6a8;
    if ((Graph *)local_6c8._0_8_ != local_6a8) {
      local_6f8 = ppGStack_6b0;
      uVar30 = 1;
      pGVar33 = (Graph *)local_6c8._16_8_;
      this_00 = (Graph *)local_6c8._0_8_;
      do {
        pdVar17 = van_kampen::Graph::nodes(this_00);
        ppNVar38 = (pdVar17->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>)
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        if (1 < ((long)(pdVar17->
                       super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(pdVar17->
                       super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x2c8590b21642c859 +
                ((long)(pdVar17->
                       super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                       _M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)(pdVar17->
                       super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                       _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x2c8590b21642c859
                + (((long)ppNVar38 -
                    (long)(pdVar17->
                          super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                  (ulong)(ppNVar38 == (_Map_pointer)0x0)) * 2) {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    ((path *)local_470,&local_4f0,auto_format);
          cVar34 = '\x01';
          if (9 < uVar30) {
            uVar16 = uVar30;
            cVar11 = '\x04';
            do {
              cVar34 = cVar11;
              if (uVar16 < 100) {
                cVar34 = cVar34 + -2;
                goto LAB_00129c04;
              }
              if (uVar16 < 1000) {
                cVar34 = cVar34 + -1;
                goto LAB_00129c04;
              }
              if (uVar16 < 10000) goto LAB_00129c04;
              bVar5 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              cVar11 = cVar34 + '\x04';
            } while (bVar5);
            cVar34 = cVar34 + '\x01';
          }
LAB_00129c04:
          local_5e0 = local_5d0;
          std::__cxx11::string::_M_construct((ulong)&local_5e0,cVar34);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_5e0,local_5d8,uVar30);
          plVar21 = (long *)std::__cxx11::string::append((char *)&local_5e0);
          local_648 = &local_638;
          plVar23 = plVar21 + 2;
          if ((long *)*plVar21 == plVar23) {
            local_638 = *plVar23;
            lStack_630 = plVar21[3];
          }
          else {
            local_638 = *plVar23;
            local_648 = (long *)*plVar21;
          }
          local_640 = plVar21[1];
          *plVar21 = (long)plVar23;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_648,(ulong)local_4c8._M_p);
          local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
          psVar24 = (size_type *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar24) {
            local_688.field_2._M_allocated_capacity = *psVar24;
            local_688.field_2._8_8_ = plVar21[3];
          }
          else {
            local_688.field_2._M_allocated_capacity = *psVar24;
            local_688._M_dataplus._M_p = (pointer)*plVar21;
          }
          local_688._M_string_length = plVar21[1];
          *plVar21 = (long)psVar24;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          std::filesystem::__cxx11::path::path((path *)local_4a8,&local_688,auto_format);
          std::filesystem::__cxx11::operator/((path *)local_628,(path *)local_470,(path *)local_4a8)
          ;
          std::ofstream::ofstream
                    (local_438,(char *)CONCAT44(local_628._4_4_,local_628._0_4_),_S_out);
          std::filesystem::__cxx11::path::~path((path *)local_628);
          std::filesystem::__cxx11::path::~path((path *)local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688._M_dataplus._M_p != &local_688.field_2) {
            operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
          }
          if (local_648 != &local_638) {
            operator_delete(local_648,local_638 + 1);
          }
          if (local_5e0 != local_5d0) {
            operator_delete(local_5e0,local_5d0[0] + 1);
          }
          std::filesystem::__cxx11::path::~path((path *)local_470);
          van_kampen::Graph::printSelf(this_00,(ostream *)local_438,local_4d0);
          uVar30 = uVar30 + 1;
          local_438 = (undefined1  [8])local_660;
          *(undefined8 *)(local_438 + (long)local_660[-3]) = local_668;
          std::filebuf::~filebuf((filebuf *)&sStack_430);
          std::ios_base::~ios_base(local_340);
        }
        this_00 = this_00 + 1;
        if (this_00 == pGVar33) {
          this_00 = local_6f8[1];
          local_6f8 = local_6f8 + 1;
          pGVar33 = this_00 + 3;
        }
      } while (this_00 != pGVar29);
    }
    std::deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::~deque
              ((deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)local_6d8);
  }
  (*(this->super_DiagrammGeneratingAlgorithm)._vptr_DiagrammGeneratingAlgorithm[3])();
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (&local_580);
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::~vector(&local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &local_4b8) {
    operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_p != &local_518) {
    operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_568._32_8_ != local_568 + 0x30) {
    operator_delete((void *)local_568._32_8_,local_568._48_8_ + 1);
  }
  if ((undefined1 *)local_568._0_8_ != local_568 + 0x10) {
    operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
  }
  return 0;
}

Assistant:

int main(int argc, const char **argv)
{
    using namespace van_kampen;

    try
    {
        van_kampen::ConsoleFlags flags(argc, argv);
        std::ifstream inputFile(flags.inputFileName);
        if (!inputFile.good())
        {
            throw std::invalid_argument("cannot open '" + flags.inputFileName + "'");
        }
        std::string text((std::istreambuf_iterator<char>(inputFile)),
                         std::istreambuf_iterator<char>());

        std::vector<std::vector<van_kampen::GroupElement>> words = van_kampen::GroupRepresentationParser::parse(text);
        auto hub = words.back();
        if (!flags.quiet)
        {
            std::clog << "Total relations count: " << words.size() << std::endl;
            std::clog << "Hub size: " << hub.size() << std::endl;
        }
        words.pop_back();
        if (flags.shuffleGroup)
        {
            std::random_shuffle(words.begin(), words.end());
        }
        if (!flags.notSort)
        {
            std::stable_sort(words.begin(),
                             words.end(),
                             [](const std::vector<van_kampen::GroupElement> &a, const std::vector<van_kampen::GroupElement> &b) {
                                 return a.size() < b.size();
                             });
        }
        words.push_back(hub);
        std::unique_ptr<DiagrammGeneratingAlgorithm> algo;
        if (flags.iterativeAlgo)
        {
            auto iterative = std::make_unique<IterativeAlgorithm>();
            iterative->cellsLimit = flags.cellsLimit;
            iterative->quiet = flags.quiet;
            algo.reset(iterative.release());
        }
        else if (flags.mergingAlgo)
        {
            auto merging = std::make_unique<MergingAlgorithm>();
            merging->limit = flags.cellsLimit;
            merging->quiet = flags.quiet;
            algo.reset(merging.release());
        }
        else if (flags.largeFirstAlgo)
        {
            auto largeFirst = std::make_unique<LargeFirstAlgorithm>();
            largeFirst->cellsLimit = flags.cellsLimit;
            largeFirst->quiet = flags.quiet;
            largeFirst->maximalSmallForOneBig = flags.perLarge;
            algo.reset(largeFirst.release());
        }

        algo->generate(words);

        {
            std::ofstream wordOutputFile(flags.wordOutputFileName);
            if (!wordOutputFile.good())
            {
                std::cerr << "cannot write to file '" << flags.wordOutputFileName << "'" << std::endl;
            }
            else
            {
                std::vector<van_kampen::Transition> word = algo->diagramm().getCircuit();
                for (std::size_t i = 0; i < word.size(); ++i)
                {
                    auto &letter = word[i];
                    wordOutputFile << letter.label.name << (letter.label.reversed ? "^(-1)" : "");
                    if (i < word.size() - 1)
                    {
                        wordOutputFile << "*";
                    }
                }
            }
        }


        if (!flags.split)
        {
            std::ofstream outFile(flags.outputFileName);
            if (!outFile.good())
            {
                throw std::invalid_argument("cannot write to file '" + flags.outputFileName + "'");
            }
            algo->graph().printSelf(outFile, flags.outputFormat);
        }
        else
        {
            std::deque<van_kampen::Graph> comps = splitToStrongComponents(algo->graph(), [](const Transition &tr) {
                return tr.priority >= 0.01;
            });
            std::filesystem::create_directory(flags.outputFileNameWoEx);
            std::size_t compId = 1;
            for (const van_kampen::Graph &comp : comps)
            {
                if (comp.nodes().size() < 2)
                    continue;
                std::ofstream outFile(std::filesystem::path(flags.outputFileNameWoEx) / (std::to_string(compId) + "." + flags.outputFormatString));
                comp.printSelf(outFile, flags.outputFormat);
                ++compId;
            }
        }
    }
    catch (const std::exception &e)
    {
        std::cerr << e.what() << '\n';
        return 0;
    }
}